

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O0

Instruction * __thiscall
spvtools::opt::analysis::DebugInfoManager::GetDebugInfoNone(DebugInfoManager *this)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l;
  uint32_t res_id;
  bool bVar1;
  uint32_t ty_id;
  IRContext *pIVar2;
  Instruction *pIVar3;
  IRContext *this_00;
  TypeManager *this_01;
  DefUseManager *this_02;
  Operand *local_148;
  undefined1 local_138 [12];
  uint local_12c;
  iterator local_128;
  IRContext *local_120;
  SmallVector<unsigned_int,_2UL> local_118;
  uint32_t local_ec;
  iterator local_e8;
  undefined8 local_e0;
  SmallVector<unsigned_int,_2UL> local_d8;
  Operand local_b0;
  Operand OStack_80;
  iterator local_50;
  pointer local_48;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_40;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_28;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  dbg_info_none_inst;
  uint32_t result_id;
  DebugInfoManager *this_local;
  
  if (this->debug_info_none_inst_ == (Instruction *)0x0) {
    pIVar2 = context(this);
    dbg_info_none_inst._M_t.
    super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
    ._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
    .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
         IRContext::TakeNextId(pIVar2);
    pIVar3 = (Instruction *)::operator_new(0x70);
    pIVar2 = context(this);
    this_00 = context(this);
    this_01 = IRContext::get_type_mgr(this_00);
    ty_id = TypeManager::GetVoidTypeId(this_01);
    res_id = dbg_info_none_inst._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_;
    local_ec = GetDbgSetImportId(this);
    local_e8 = &local_ec;
    local_e0._0_4_ = 1;
    local_e0._4_4_ = 0;
    init_list_00._M_len = 1;
    init_list_00._M_array = local_e8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_d8,init_list_00);
    Operand::Operand(&local_b0,SPV_OPERAND_TYPE_ID,&local_d8);
    local_12c = 0;
    local_128 = &local_12c;
    local_120 = (IRContext *)0x1;
    init_list._M_len = 1;
    init_list._M_array = local_128;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_118,init_list);
    Operand::Operand(&OStack_80,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_118);
    local_50 = &local_b0;
    local_48 = (pointer)0x2;
    std::allocator<spvtools::opt::Operand>::allocator
              ((allocator<spvtools::opt::Operand> *)(local_138 + 0xb));
    __l._M_len = (size_type)local_48;
    __l._M_array = local_50;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              (&local_40,__l,(allocator_type *)(local_138 + 0xb));
    opt::Instruction::Instruction(pIVar3,pIVar2,OpExtInst,ty_id,res_id,&local_40);
    std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
    unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
              ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                *)&local_28,pIVar3);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_40)
    ;
    std::allocator<spvtools::opt::Operand>::~allocator
              ((allocator<spvtools::opt::Operand> *)(local_138 + 0xb));
    local_148 = (Operand *)&local_50;
    do {
      local_148 = local_148 + -1;
      Operand::~Operand(local_148);
    } while (local_148 != &local_b0);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_118);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_d8);
    pIVar2 = context(this);
    IRContext::module(pIVar2);
    Module::ext_inst_debuginfo_begin((Module *)local_138);
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_138);
    pIVar3 = opt::Instruction::InsertBefore(pIVar3,&local_28);
    this->debug_info_none_inst_ = pIVar3;
    RegisterDbgInst(this,this->debug_info_none_inst_);
    pIVar2 = context(this);
    bVar1 = IRContext::AreAnalysesValid(pIVar2,kAnalysisBegin);
    if (bVar1) {
      pIVar2 = context(this);
      this_02 = IRContext::get_def_use_mgr(pIVar2);
      DefUseManager::AnalyzeInstDefUse(this_02,this->debug_info_none_inst_);
    }
    this_local = (DebugInfoManager *)this->debug_info_none_inst_;
    std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
    ~unique_ptr(&local_28);
  }
  else {
    this_local = (DebugInfoManager *)this->debug_info_none_inst_;
  }
  return (Instruction *)this_local;
}

Assistant:

Instruction* DebugInfoManager::GetDebugInfoNone() {
  if (debug_info_none_inst_ != nullptr) return debug_info_none_inst_;

  uint32_t result_id = context()->TakeNextId();
  std::unique_ptr<Instruction> dbg_info_none_inst(new Instruction(
      context(), spv::Op::OpExtInst, context()->get_type_mgr()->GetVoidTypeId(),
      result_id,
      {
          {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {GetDbgSetImportId()}},
          {spv_operand_type_t::SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
           {static_cast<uint32_t>(CommonDebugInfoDebugInfoNone)}},
      }));

  // Add to the front of |ext_inst_debuginfo_|.
  debug_info_none_inst_ =
      context()->module()->ext_inst_debuginfo_begin()->InsertBefore(
          std::move(dbg_info_none_inst));

  RegisterDbgInst(debug_info_none_inst_);
  if (context()->AreAnalysesValid(IRContext::Analysis::kAnalysisDefUse))
    context()->get_def_use_mgr()->AnalyzeInstDefUse(debug_info_none_inst_);
  return debug_info_none_inst_;
}